

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O0

void printInt32(SStream *O,int32_t val)

{
  uint in_ESI;
  SStream *in_RDI;
  
  if ((int)in_ESI < 0) {
    if ((int)in_ESI < -9) {
      if (in_ESI == 0x80000000) {
        SStream_concat(in_RDI,"-0x%x",0x80000000);
      }
      else {
        SStream_concat(in_RDI,"-0x%x",(ulong)-in_ESI);
      }
    }
    else {
      SStream_concat(in_RDI,"-%u",(ulong)-in_ESI);
    }
  }
  else if ((int)in_ESI < 10) {
    SStream_concat(in_RDI,"%u",(ulong)in_ESI);
  }
  else {
    SStream_concat(in_RDI,"0x%x",(ulong)in_ESI);
  }
  return;
}

Assistant:

void printInt32(SStream *O, int32_t val)
{
	if (val >= 0) {
		if (val > HEX_THRESHOLD)
			SStream_concat(O, "0x%x", val);
		else
			SStream_concat(O, "%u", val);
	} else {
		if (val <- HEX_THRESHOLD) {
			if (val == INT_MIN)
				SStream_concat(O, "-0x%x", (uint32_t)val);
			else
				SStream_concat(O, "-0x%x", (uint32_t)-val);
			}
		else
			SStream_concat(O, "-%u", -val);
	}
}